

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

bool_t hexEqRev_fast(void *buf,char *hex)

{
  size_t sVar1;
  
  sVar1 = strLen(hex);
  while( true ) {
    if (sVar1 == 0) {
      return 1;
    }
    if (*buf != (byte)(hex_dec_table[(byte)hex[sVar1 - 2]] << 4 |
                      hex_dec_table[(byte)hex[sVar1 - 1]])) break;
    buf = (void *)((long)buf + 1);
    sVar1 = sVar1 - 2;
  }
  return 0;
}

Assistant:

bool_t FAST(hexEqRev)(const void* buf, const char* hex)
{
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	hex = hex + count;
	for (; count; count -= 2, buf = (const octet*)buf + 1)
		if (*(const octet*)buf != hexToO(hex -= 2))
			return FALSE;
	return TRUE;
}